

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_header.c
# Opt level: O2

void mk_header_response_reset(response_headers *header)

{
  header->status = -1;
  header->connection = 0;
  header->sent = 0;
  header->ranges[0] = -1;
  header->ranges[1] = -1;
  header->content_length = -1;
  header->transfer_encoding = -1;
  header->upgrade = -1;
  header->last_modified = -1;
  header->cgi = 0;
  header->_extra_rows = (mk_iov *)0x0;
  (header->allow_methods).len = 0;
  (header->content_type).data = (char *)0x0;
  (header->content_type).len = 0;
  (header->content_encoding).data = (char *)0x0;
  (header->content_encoding).len = 0;
  header->location = (char *)0x0;
  (header->headers_iov).io = header->__iov_io;
  (header->headers_iov).buf_to_free = header->__iov_buf;
  (header->headers_iov).iov_idx = 0;
  (header->headers_iov).buf_idx = 0;
  (header->headers_iov).total_len = 0;
  (header->headers_iov).size = 0x20;
  return;
}

Assistant:

void mk_header_response_reset(struct response_headers *header)
{
    struct mk_iov *iov;

    header->status = -1;
    header->sent = MK_FALSE;
    header->ranges[0] = -1;
    header->ranges[1] = -1;
    header->content_length = -1;
    header->connection = 0;
    header->transfer_encoding = -1;
    header->last_modified = -1;
    header->upgrade = -1;
    header->cgi = SH_NOCGI;
    mk_ptr_reset(&header->content_type);
    mk_ptr_reset(&header->content_encoding);
    header->location = NULL;
    header->_extra_rows = NULL;
    header->allow_methods.len = 0;

    /* Initialize headers IOV */
    iov = &header->headers_iov;
    iov->io          = (struct iovec *) &header->__iov_io;
    iov->buf_to_free = (void *) &header->__iov_buf;
    mk_iov_init(&header->headers_iov, MK_HEADER_IOV, 0);
}